

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type __thiscall
FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>
::dx(FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>
     *this,int i)

{
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *in_RDI;
  value_type vVar1;
  value_type vVar2;
  int in_stack_ffffffffffffffdc;
  
  vVar1 = FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
          ::dx((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_RDI,in_stack_ffffffffffffffdc);
  vVar2 = FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::dx(in_RDI,in_stack_ffffffffffffffdc)
  ;
  return vVar1 - vVar2;
}

Assistant:

const value_type dx(int i) const {return left_.dx(i) - right_.dx(i);}